

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

boolean wishymatch(char *u_str,char *o_str,boolean retry_inverted)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char local_148 [8];
  char buf [256];
  char *local_40;
  char *p;
  char *o_of;
  char *u_of;
  char *pcStack_20;
  boolean retry_inverted_local;
  char *o_str_local;
  char *u_str_local;
  
  if ((flags.debug == '\0') || (iVar2 = strcmp(o_str,"beartrap"), iVar2 != 0)) {
    bVar1 = fuzzymatch(u_str,o_str," -",'\x01');
    if (bVar1 == '\0') {
      if (retry_inverted != '\0') {
        pcVar3 = strstri(u_str," of ");
        pcVar4 = strstri(o_str," of ");
        if ((pcVar3 != (char *)0x0) && (pcVar4 == (char *)0x0)) {
          strcpy(local_148,pcVar3 + 4);
          pcVar4 = strcat(local_148," ");
          local_40 = eos(pcVar4);
          o_str_local = u_str;
          while (o_str_local < pcVar3) {
            *local_40 = *o_str_local;
            local_40 = local_40 + 1;
            o_str_local = o_str_local + 1;
          }
          *local_40 = '\0';
          bVar1 = fuzzymatch(local_148,o_str," -",'\x01');
          return bVar1;
        }
        if ((pcVar4 != (char *)0x0) && (pcVar3 == (char *)0x0)) {
          strcpy(local_148,pcVar4 + 4);
          pcVar3 = strcat(local_148," ");
          local_40 = eos(pcVar3);
          pcStack_20 = o_str;
          while (pcStack_20 < pcVar4) {
            *local_40 = *pcStack_20;
            local_40 = local_40 + 1;
            pcStack_20 = pcStack_20 + 1;
          }
          *local_40 = '\0';
          bVar1 = fuzzymatch(u_str,local_148," -",'\x01');
          return bVar1;
        }
      }
      iVar2 = strncmp(o_str,"dwarvish ",9);
      if (iVar2 == 0) {
        iVar2 = strncasecmp(u_str,"dwarven ",8);
        if (iVar2 == 0) {
          bVar1 = fuzzymatch(u_str + 8,o_str + 9," -",'\x01');
          return bVar1;
        }
      }
      else {
        iVar2 = strncmp(o_str,"elven ",6);
        if (iVar2 == 0) {
          iVar2 = strncasecmp(u_str,"elvish ",7);
          if (iVar2 == 0) {
            bVar1 = fuzzymatch(u_str + 7,o_str + 6," -",'\x01');
            return bVar1;
          }
          iVar2 = strncasecmp(u_str,"elfin ",6);
          if (iVar2 == 0) {
            bVar1 = fuzzymatch(u_str + 6,o_str + 6," -",'\x01');
            return bVar1;
          }
        }
        else {
          iVar2 = strcmp(o_str,"aluminum");
          if ((iVar2 == 0) &&
             (iVar2 = strncasecmp(u_str,"aluminium",0xffffffffffffffff), iVar2 == 0)) {
            bVar1 = fuzzymatch(u_str + 9,o_str + 8," -",'\x01');
            return bVar1;
          }
        }
      }
      u_str_local._7_1_ = 0;
    }
    else {
      u_str_local._7_1_ = 1;
    }
  }
  else {
    iVar2 = strncasecmp(o_str,u_str,8);
    u_str_local._7_1_ = (iVar2 != 0 ^ 0xffU) & 1;
  }
  return u_str_local._7_1_;
}

Assistant:

static boolean wishymatch(const char *u_str,	/* from user, so might be variant spelling */
			  const char *o_str,	/* from objects[], so is in canonical form */
			  boolean retry_inverted)	/* optional extra "of" handling */
{
	/* special case: wizards can wish for traps.  The object is "beartrap"
	 * and the trap is "bear trap", so to let wizards wish for both we
	 * must not fuzzymatch.
	 */
	if (wizard && !strcmp(o_str, "beartrap"))
	    return !strncmpi(o_str, u_str, 8);

	/* ignore spaces & hyphens and upper/lower case when comparing */
	if (fuzzymatch(u_str, o_str, " -", TRUE)) return TRUE;

	if (retry_inverted) {
	    const char *u_of, *o_of;
	    char *p, buf[BUFSZ];

	    /* when just one of the strings is in the form "foo of bar",
	       convert it into "bar foo" and perform another comparison */
	    u_of = strstri(u_str, " of ");
	    o_of = strstri(o_str, " of ");
	    if (u_of && !o_of) {
		strcpy(buf, u_of + 4);
		p = eos(strcat(buf, " "));
		while (u_str < u_of) *p++ = *u_str++;
		*p = '\0';
		return fuzzymatch(buf, o_str, " -", TRUE);
	    } else if (o_of && !u_of) {
		strcpy(buf, o_of + 4);
		p = eos(strcat(buf, " "));
		while (o_str < o_of) *p++ = *o_str++;
		*p = '\0';
		return fuzzymatch(u_str, buf, " -", TRUE);
	    }
	}

	/* [note: if something like "elven speed boots" ever gets added, these
	   special cases should be changed to call wishymatch() recursively in
	   order to get the "of" inversion handling] */
	if (!strncmp(o_str, "dwarvish ", 9)) {
	    if (!strncmpi(u_str, "dwarven ", 8))
		return fuzzymatch(u_str + 8, o_str + 9, " -", TRUE);
	} else if (!strncmp(o_str, "elven ", 6)) {
	    if (!strncmpi(u_str, "elvish ", 7))
		return fuzzymatch(u_str + 7, o_str + 6, " -", TRUE);
	    else if (!strncmpi(u_str, "elfin ", 6))
		return fuzzymatch(u_str + 6, o_str + 6, " -", TRUE);
	} else if (!strcmp(o_str, "aluminum")) {
		/* this special case doesn't really fit anywhere else... */
		/* (note that " wand" will have been stripped off by now) */
	    if (!strcmpi(u_str, "aluminium"))
		return fuzzymatch(u_str + 9, o_str + 8, " -", TRUE);
	}

	return FALSE;
}